

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O2

CSVError * __thiscall
duckdb::CSVError::CastError
          (CSVError *__return_storage_ptr__,CSVError *this,CSVReaderOptions *options,
          string *column_name,string *cast_error,idx_t column_idx,string *csv_row,
          LinesPerBoundary error_info,idx_t row_byte_position,optional_idx byte_position,
          LogicalTypeId type,string *current_path)

{
  LinesPerBoundary error_info_p;
  bool bVar1;
  ostream *poVar2;
  LogicalTypeId type_00;
  char *pcVar3;
  undefined7 in_stack_00000031;
  string local_398;
  string *local_378;
  idx_t iStack_370;
  string local_360;
  string local_340;
  ostringstream how_to_fix_it;
  ostringstream error;
  
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
  poVar2 = ::std::operator<<((ostream *)&error,"Error when converting column \"");
  poVar2 = ::std::operator<<(poVar2,(string *)options);
  ::std::operator<<(poVar2,"\". ");
  poVar2 = ::std::operator<<((ostream *)&error,(string *)column_name);
  ::std::operator<<(poVar2,'\n');
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&how_to_fix_it);
  poVar2 = ::std::operator<<((ostream *)&how_to_fix_it,"Column ");
  poVar2 = ::std::operator<<(poVar2,(string *)options);
  poVar2 = ::std::operator<<(poVar2," is being converted as type ");
  LogicalTypeIdToString_abi_cxx11_(&local_398,(duckdb *)(byte_position.index & 0xff),type_00);
  poVar2 = ::std::operator<<(poVar2,(string *)&local_398);
  ::std::operator<<(poVar2,'\n');
  ::std::__cxx11::string::~string((string *)&local_398);
  bVar1 = CSVReaderOptions::WasTypeManuallySet((CSVReaderOptions *)this,(idx_t)cast_error);
  if (bVar1) {
    pcVar3 = 
    "This type was either manually set or derived from an existing table. Select a different type to correctly parse this column."
    ;
  }
  else {
    poVar2 = ::std::operator<<((ostream *)&how_to_fix_it,
                               "This type was auto-detected from the CSV file.");
    ::std::operator<<(poVar2,'\n');
    poVar2 = ::std::operator<<((ostream *)&how_to_fix_it,"Possible solutions:");
    ::std::operator<<(poVar2,'\n');
    poVar2 = ::std::operator<<((ostream *)&how_to_fix_it,
                               "* Override the type for this column manually by setting the type explicitly, e.g. types={\'"
                              );
    poVar2 = ::std::operator<<(poVar2,(string *)options);
    poVar2 = ::std::operator<<(poVar2,"\': \'VARCHAR\'}");
    ::std::operator<<(poVar2,'\n');
    poVar2 = ::std::operator<<((ostream *)&how_to_fix_it,
                               "* Set the sample size to a larger value to enable the auto-detection to scan more values, e.g. sample_size=-1"
                              );
    ::std::operator<<(poVar2,'\n');
    pcVar3 = "* Use a COPY statement to automatically derive types from an existing table.";
  }
  poVar2 = ::std::operator<<((ostream *)&how_to_fix_it,pcVar3);
  ::std::operator<<(poVar2,'\n');
  poVar2 = ::std::operator<<((ostream *)&how_to_fix_it,
                             "* Check whether the null string value is set correctly (e.g., nullstr = \'N/A\')"
                            );
  ::std::operator<<(poVar2,'\n');
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::string((string *)&local_360,(string *)column_idx);
  local_378 = csv_row;
  iStack_370 = error_info.boundary_idx;
  ::std::__cxx11::stringbuf::str();
  error_info_p.lines_in_batch = iStack_370;
  error_info_p.boundary_idx = (idx_t)local_378;
  CSVError(__return_storage_ptr__,&local_340,CAST_ERROR,(idx_t)cast_error,&local_360,error_info_p,
           error_info.lines_in_batch,(optional_idx)row_byte_position,(CSVReaderOptions *)this,
           (string *)&local_398,(string *)CONCAT71(in_stack_00000031,type));
  ::std::__cxx11::string::~string((string *)&local_398);
  ::std::__cxx11::string::~string((string *)&local_360);
  ::std::__cxx11::string::~string((string *)&local_340);
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&how_to_fix_it);
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
  return __return_storage_ptr__;
}

Assistant:

CSVError CSVError::CastError(const CSVReaderOptions &options, const string &column_name, string &cast_error,
                             idx_t column_idx, string &csv_row, LinesPerBoundary error_info, idx_t row_byte_position,
                             optional_idx byte_position, LogicalTypeId type, const string &current_path) {
	std::ostringstream error;
	// Which column
	error << "Error when converting column \"" << column_name << "\". ";
	// What was the cast error
	error << cast_error << '\n';
	std::ostringstream how_to_fix_it;
	how_to_fix_it << "Column " << column_name << " is being converted as type " << LogicalTypeIdToString(type) << '\n';
	if (!options.WasTypeManuallySet(column_idx)) {
		how_to_fix_it << "This type was auto-detected from the CSV file." << '\n';
		how_to_fix_it << "Possible solutions:" << '\n';
		how_to_fix_it << "* Override the type for this column manually by setting the type explicitly, e.g. types={'"
		              << column_name << "': 'VARCHAR'}" << '\n';
		how_to_fix_it
		    << "* Set the sample size to a larger value to enable the auto-detection to scan more values, e.g. "
		       "sample_size=-1"
		    << '\n';
		how_to_fix_it << "* Use a COPY statement to automatically derive types from an existing table." << '\n';
	} else {
		how_to_fix_it
		    << "This type was either manually set or derived from an existing table. Select a different type to "
		       "correctly parse this column."
		    << '\n';
	}
	how_to_fix_it << "* Check whether the null string value is set correctly (e.g., nullstr = 'N/A')" << '\n';

	return CSVError(error.str(), CAST_ERROR, column_idx, csv_row, error_info, row_byte_position, byte_position, options,
	                how_to_fix_it.str(), current_path);
}